

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int ffh_resume(lua_State *L,lua_State *co,int wrap)

{
  GCstr *pGVar1;
  int in_EDX;
  lua_State *in_RSI;
  long in_RDI;
  ErrMsg em;
  undefined8 in_stack_ffffffffffffff68;
  ErrMsg em_00;
  lua_State *in_stack_ffffffffffffff70;
  undefined4 *puVar2;
  int local_6c;
  
  em_00 = (ErrMsg)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (((in_RSI->cframe == (void *)0x0) && (in_RSI->status < 2)) &&
     ((in_RSI->status != '\0' || (in_RSI->top != in_RSI->base)))) {
    lj_state_growstack(in_stack_ffffffffffffff70,em_00);
    local_6c = 0;
  }
  else {
    if (in_EDX != 0) {
      lj_err_caller(in_stack_ffffffffffffff70,em_00);
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + -4) = 0xfffffffe;
    puVar2 = *(undefined4 **)(in_RDI + 0x10);
    pGVar1 = lj_err_str(in_RSI,LJ_ERR_ERRMEM);
    *puVar2 = (int)pGVar1;
    puVar2[1] = 0xfffffffb;
    local_6c = 3;
  }
  return local_6c;
}

Assistant:

static int ffh_resume(lua_State *L, lua_State *co, int wrap)
{
  if (co->cframe != NULL || co->status > LUA_YIELD ||
      (co->status == LUA_OK && co->top == co->base)) {
    ErrMsg em = co->cframe ? LJ_ERR_CORUN : LJ_ERR_CODEAD;
    if (wrap) lj_err_caller(L, em);
    setboolV(L->base-1-LJ_FR2, 0);
    setstrV(L, L->base-LJ_FR2, lj_err_str(L, em));
    return FFH_RES(2);
  }
  lj_state_growstack(co, (MSize)(L->top - L->base));
  return FFH_RETRY;
}